

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpTo::write
          (BlockedPumpTo *this,int __fd,void *__buf,size_t __n)

{
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var1;
  PromiseNode *pPVar2;
  Own<kj::_::PromiseNode> local_80;
  Fault f;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  pp_Var1 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  if (pp_Var1[7] == (_func_int *)0x0) {
    pPVar2 = (PromiseNode *)(pp_Var1[5] + -(long)pp_Var1[6]);
    if (__n <= (PromiseNode *)(pp_Var1[5] + -(long)pp_Var1[6])) {
      pPVar2 = (PromiseNode *)__n;
    }
    (*(code *)**(undefined8 **)pp_Var1[4])(&local_60,pp_Var1[4],__buf,pPVar2);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:810:17),_kj::_::PropagateException>
               ::anon_class_32_4_aebd93b5_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00430548;
    this_00[1].super_PromiseNode._vptr_PromiseNode = pp_Var1;
    this_00[1].dependency.disposer = (Disposer *)__n;
    this_00[1].dependency.ptr = pPVar2;
    this_00[1].continuationTracePtr = __buf;
    f.exception = (Exception *)
                  &_::
                   HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(void_const*,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
                   ::instance;
    _::maybeChain<void>(&local_50,(Promise<void> *)&f);
    pPVar2 = local_50.ptr;
    local_40.disposer = local_50.disposer;
    local_50.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_50);
    local_80.disposer = local_50.disposer;
    local_80.ptr = pPVar2;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
              ((kj *)this,(Canceler *)(pp_Var1 + 7),(Promise<void> *)&local_80);
    Own<kj::_::PromiseNode>::dispose(&local_80);
    Own<kj::_::PromiseNode>::dispose(&local_60);
    return (ssize_t)this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x326,FAILED,"canceler.isEmpty()","\"already pumping\"",
             (char (*) [16])"already pumping");
  _::Debug::Fault::fatal(&f);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }